

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreImporter::InternReadFile
          (OgreImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __uniq_ptr_data<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>,_true,_true> mesh_00;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *reader_00;
  MeshXml *mesh_01;
  DeadlyImportError *this_01;
  unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> mesh;
  MemoryStreamReader reader;
  IOStream *_stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reader,"rb",(allocator<char> *)&mesh);
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     reader.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&reader);
  if (_stream != (IOStream *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reader,".mesh",(allocator<char> *)&mesh);
    bVar1 = EndsWith(pFile,(string *)&reader,false);
    std::__cxx11::string::~string((string *)&reader);
    if (bVar1) {
      StreamReader<false,_false>::StreamReader(&reader,_stream,false);
      mesh_00.super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>.
      super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl =
           (__uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>)
           OgreBinarySerializer::ImportMesh(&reader);
      mesh._M_t.super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>.
      super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>,_true,_true>
           )(__uniq_ptr_data<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>,_true,_true>
             )mesh_00.
              super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>.
              _M_t.
              super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>
              .super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl;
      OgreBinarySerializer::ImportSkeleton
                (pIOHandler,
                 (Mesh *)mesh_00.
                         super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>
                         .super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl);
      ReadMaterials(this,pFile,pIOHandler,pScene,
                    (Mesh *)mesh_00.
                            super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>
                            .super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl);
      Ogre::Mesh::ConvertToAssimpScene
                ((Mesh *)mesh._M_t.
                         super___uniq_ptr_impl<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::Ogre::Mesh_*,_std::default_delete<Assimp::Ogre::Mesh>_>
                         .super__Head_base<0UL,_Assimp::Ogre::Mesh_*,_false>._M_head_impl,pScene);
      std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::~unique_ptr
                (&mesh);
      StreamReader<false,_false>::~StreamReader(&reader);
    }
    else {
      this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
      reader_00 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
      mesh_01 = OgreXmlSerializer::ImportMesh(reader_00);
      reader.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)mesh_01;
      OgreXmlSerializer::ImportSkeleton(pIOHandler,mesh_01);
      ReadMaterials(this,pFile,pIOHandler,pScene,mesh_01);
      MeshXml::ConvertToAssimpScene
                ((MeshXml *)
                 reader.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pScene);
      std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
      ~unique_ptr((unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_> *)
                  &reader);
      if (reader_00 != (IrrXMLReader *)0x0) {
        (*reader_00->_vptr_IIrrXMLReader[1])(reader_00);
      }
      (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])();
      (*_stream->_vptr_IOStream[1])(_stream);
    }
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 "Failed to open file ",pFile);
  DeadlyImportError::DeadlyImportError(this_01,(string *)&reader);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreImporter::InternReadFile(const std::string &pFile, aiScene *pScene, Assimp::IOSystem *pIOHandler)
{
    // Open source file
    IOStream *f = pIOHandler->Open(pFile, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open file " + pFile);
    }

    // Binary .mesh import
    if (EndsWith(pFile, ".mesh", false))
    {
        /// @note MemoryStreamReader takes ownership of f.
        MemoryStreamReader reader(f);

        // Import mesh
        std::unique_ptr<Mesh> mesh(OgreBinarySerializer::ImportMesh(&reader));

        // Import skeleton
        OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
    // XML .mesh.xml import
    else
    {
        /// @note XmlReader does not take ownership of f, hence the scoped ptr.
        std::unique_ptr<IOStream> scopedFile(f);
        std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(scopedFile.get()));
        std::unique_ptr<XmlReader> reader(irr::io::createIrrXMLReader(xmlStream.get()));

        // Import mesh
        std::unique_ptr<MeshXml> mesh(OgreXmlSerializer::ImportMesh(reader.get()));

        // Import skeleton
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
}